

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O2

ostream * Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                    (ostream *stream,AffineMatrix4T<float> *mat)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  size_t c;
  long lVar8;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  size_t lengths [4];
  
  lVar8 = 0;
  pfVar6 = mat->m_;
  for (; lVar8 != 4; lVar8 = lVar8 + 1) {
    lengths[lVar8] = 0;
    uVar7 = 0;
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
      sVar2 = Length<float>((float *)((long)pfVar6 + lVar5));
      if (uVar7 <= sVar2) {
        uVar7 = sVar2;
      }
      lengths[lVar8] = uVar7;
    }
    pfVar6 = pfVar6 + 3;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    cVar1 = '|';
    if (lVar8 == 0) {
      cVar1 = '/';
    }
    std::operator<<(stream,cVar1);
    lVar5 = 0;
    pfVar6 = mat->m_;
    for (; lVar5 != 4; lVar5 = lVar5 + 1) {
      sVar2 = lengths[lVar5];
      sVar3 = Length<float>(pfVar6);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct((ulong)local_78,((char)sVar2 - (char)sVar3) + '\x01');
      std::operator<<(stream,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)stream,*pfVar6);
      std::operator<<(poVar4,' ');
      pfVar6 = pfVar6 + 3;
    }
    poVar4 = std::operator<<(stream,(lVar8 != 0) << 5 | 0x5c);
    std::endl<char,std::char_traits<char>>(poVar4);
    mat = (AffineMatrix4T<float> *)((long)mat + 4);
  }
  std::operator<<(stream,'\\');
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct((ulong)local_78,(char)lengths[lVar8]);
    std::operator<<(stream,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    poVar4 = std::operator<<(stream,lVar8 == 3 | 0x30);
    std::operator<<(poVar4,' ');
  }
  poVar4 = std::operator<<(stream,'/');
  std::endl<char,std::char_traits<char>>(poVar4);
  return stream;
}

Assistant:

std::ostream& ShiftAffineMatrixOStream(std::ostream& stream, const M& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[M::columnsSparse];

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < M::rowsSparse; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    #if GS_ROW_VECTORS

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == M::rowsSparse ? '\\' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        /* Write implicit column */
        stream << ' ' << (r + 1 == M::rowsSparse ? '1' : '0');
        stream << ' ' << (r == 0 ? '\\' : r + 1 == M::rowsSparse ? '/' : '|')  << std::endl;
    }

    #else

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : '|')  << std::endl;
    }

    /* Write implicit row */
    stream << '\\';

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        stream << std::string(lengths[c], ' ');
        stream << (c + 1 == M::columnsSparse ? '1' : '0') << ' ';
    }

    stream << '/' << std::endl;

    #endif

    return stream;
}